

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O0

double ratio(Bigint *a,Bigint *b)

{
  int iVar1;
  double dVar2;
  int local_34;
  int local_30;
  int kb;
  int ka;
  int k;
  U db;
  U da;
  Bigint *b_local;
  Bigint *a_local;
  
  da = (U)b;
  b_local = a;
  db.d = b2d(a,&local_30);
  dVar2 = b2d(da.d,&local_34);
  iVar1 = (local_30 - local_34) + (b_local->wds - *(int *)((long)da + 0x14)) * 0x20;
  if (iVar1 < 1) {
    k = (int)((ulong)dVar2 >> 0x20);
    _ka = (double)CONCAT44(iVar1 * -0x100000 + k,SUB84(dVar2,0));
  }
  else {
    db.L[1] = iVar1 * 0x100000 + db.L[1];
    _ka = dVar2;
  }
  return db.d / _ka;
}

Assistant:

static double
ratio(Bigint *a, Bigint *b)
{
    U da, db;
    int k, ka, kb;

    dval(&da) = b2d(a, &ka);
    dval(&db) = b2d(b, &kb);
    k = ka - kb + 32*(a->wds - b->wds);
    if (k > 0)
        word0(&da) += k*Exp_msk1;
    else {
        k = -k;
        word0(&db) += k*Exp_msk1;
    }
    return dval(&da) / dval(&db);
}